

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_initamf(flvtag_t *tag,uint32_t dts)

{
  tag->data = (uint8_t *)0x0;
  tag->aloc = 0;
  flvtag_reserve(tag,0x800);
  *tag->data = '\x12';
  tag->data[4] = (uint8_t)(dts >> 0x10);
  tag->data[5] = (uint8_t)(dts >> 8);
  tag->data[6] = (uint8_t)dts;
  tag->data[7] = (uint8_t)(dts >> 0x18);
  tag->data[8] = '\0';
  tag->data[9] = '\0';
  tag->data[10] = '\0';
  flvtag_updatesize(tag,0);
  return 1;
}

Assistant:

int flvtag_initamf(flvtag_t* tag, uint32_t dts)
{
    flvtag_init(tag);
    flvtag_reserve(tag, FLVTAG_PREALOC);
    tag->data[0] = flvtag_type_scriptdata;
    tag->data[4] = dts >> 16;
    tag->data[5] = dts >> 8;
    tag->data[6] = dts >> 0;
    tag->data[7] = dts >> 24;
    tag->data[8] = 0; // StreamID
    tag->data[9] = 0; // StreamID
    tag->data[10] = 0; // StreamID
    flvtag_updatesize(tag, 0);
    return 1;
}